

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<Fad<double>_>::InsertSub
          (TPZMatrix<Fad<double>_> *this,int64_t sRow,int64_t sCol,int64_t rowSize,int64_t colSize,
          int64_t pRow,int64_t pCol,TPZMatrix<Fad<double>_> *pA)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long local_78;
  Fad<double> local_50;
  
  lVar2 = rowSize + pRow;
  if ((lVar2 <= (pA->super_TPZBaseMatrix).fRow) &&
     (colSize + pCol <= (pA->super_TPZBaseMatrix).fCol)) {
    local_78 = sRow;
    for (; lVar3 = pCol, lVar4 = sCol, pRow < lVar2; pRow = pRow + 1) {
      for (; lVar3 < colSize + pCol; lVar3 = lVar3 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_50,this,local_78,lVar4);
        (*(pA->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (pA,pRow,lVar3,&local_50);
        Fad<double>::~Fad(&local_50);
        lVar4 = lVar4 + 1;
      }
      local_78 = local_78 + 1;
    }
    return 1;
  }
  iVar1 = Error("InsertSub <the sub-matrix is too big that target>",(char *)0x0);
  return iVar1;
}

Assistant:

int TPZMatrix<TVar>::InsertSub(const int64_t sRow,const int64_t sCol,const int64_t rowSize,
							   const int64_t colSize,const int64_t pRow,const int64_t pCol, TPZMatrix<TVar> *pA ) const {
	
	
    if ( ((pRow + rowSize) > pA->Rows()) || ((pCol + colSize) > pA->Cols())) {
        return( Error( "InsertSub <the sub-matrix is too big that target>" ) );
    }
	
    int64_t NewRowSize = rowSize+pRow;
    int64_t NewColSize = colSize+pCol;
	
	
    int64_t row = sRow;
    for ( int64_t r = pRow; r < NewRowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = pCol ; c < NewColSize; c++, col++ ) {
            pA->PutVal( r, c, GetVal( row, col ) );
        }
    }
    return( 1 );
}